

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomNumberGenerator.cc
# Opt level: O3

double __thiscall OpenMesh::RandomNumberGenerator::getRand(RandomNumberGenerator *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  
  if (this->iterations_ == 0) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    uVar3 = 1;
    do {
      iVar2 = rand();
      dVar4 = (double)iVar2 + dVar4 * 2147483648.0;
      bVar1 = uVar3 < this->iterations_;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar1);
  }
  return dVar4 / this->maxNum_;
}

Assistant:

double RandomNumberGenerator::getRand() const {
  double randNum = 0.0;
  for ( unsigned int i = 0 ; i < iterations_; ++i ) {
    randNum *= (RAND_MAX + 1.0);
    randNum += rand();
  }

  return randNum / maxNum_;
}